

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

void __thiscall flatbuffers::JsonPrinter::OutputIdentifier(JsonPrinter *this,string *name)

{
  if (this->opts->strict_json == true) {
    std::__cxx11::string::push_back((char)this->text);
  }
  std::__cxx11::string::_M_append((char *)this->text,(ulong)(name->_M_dataplus)._M_p);
  if (this->opts->strict_json == true) {
    std::__cxx11::string::push_back((char)this->text);
    return;
  }
  return;
}

Assistant:

void OutputIdentifier(const std::string &name) {
    if (opts.strict_json) text += '\"';
    text += name;
    if (opts.strict_json) text += '\"';
  }